

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellBST::LoadableGetStateBlock_w
          (ChElementShellBST *this,int block_offset,ChStateDelta *mD)

{
  int iVar1;
  double *pdVar2;
  long lVar3;
  pointer psVar4;
  element_type *peVar5;
  double *pdVar6;
  long lVar7;
  Index index;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  
  iVar1 = this->n_usednodes;
  if (0 < (long)iVar1) {
    pdVar2 = (mD->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    lVar3 = (mD->super_ChVectorDynamic<double>).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    psVar4 = (this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar7 = 0;
    pdVar6 = pdVar2 + block_offset;
    do {
      if ((block_offset < 0) || (lVar10 = lVar7 * 3 + (long)block_offset, lVar3 + -3 < lVar10)) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      uVar8 = 3;
      peVar5 = psVar4[this->nodes_used_to_six[lVar7]].
               super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (((ulong)pdVar2 & 7) == 0) {
        uVar9 = -((uint)((ulong)(pdVar2 + lVar10) >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar9 < 3) {
          uVar8 = (ulong)uVar9;
        }
        if (uVar9 != 0) goto LAB_00784b6c;
      }
      else {
LAB_00784b6c:
        uVar11 = 0;
        do {
          pdVar6[uVar11] = *(double *)((long)&peVar5->X0 + uVar11 * 8 + 0xffffffffffffff80);
          uVar11 = uVar11 + 1;
        } while (uVar8 != uVar11);
      }
      if (uVar8 < 3) {
        do {
          pdVar6[uVar8] = *(double *)((long)&peVar5->X0 + uVar8 * 8 + 0xffffffffffffff80);
          uVar8 = uVar8 + 1;
        } while (uVar8 != 3);
      }
      lVar7 = lVar7 + 1;
      pdVar6 = pdVar6 + 3;
    } while (lVar7 != iVar1);
  }
  return;
}

Assistant:

void ChElementShellBST::LoadableGetStateBlock_w(int block_offset, ChStateDelta& mD) {
	for (int i = 0; i < n_usednodes; ++i) {
		mD.segment(block_offset + 3 * i, 3) = m_nodes[nodes_used_to_six[i]]->GetPos_dt().eigen();
	}
}